

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int fits_read_ascii_region(char *filename,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  char cVar1;
  int iVar2;
  int *__ptr;
  FILE *__stream;
  char *pcVar3;
  size_t sVar4;
  ushort **ppuVar5;
  undefined1 *puVar6;
  void *pvVar7;
  long lVar8;
  int *in_RCX;
  undefined8 *in_RDX;
  int *in_RSI;
  char *in_RDI;
  bool bVar9;
  bool bVar10;
  double dVar11;
  RgnShape *tmpShape;
  RgnShape *newShape;
  SAORegion *aRgn;
  coordFmt cFmt;
  FILE *rgnFile;
  int done;
  int i;
  int negdec;
  int nCoords;
  int nParams;
  double ysave;
  double xsave;
  double div;
  double ss;
  double y;
  double x;
  double Y;
  double X;
  double *coords;
  long dd;
  long mm;
  long hh;
  long lineLen;
  long allocLen;
  char *endp;
  char *pY;
  char *pX;
  char *currLoc;
  char *paramPtr;
  char *namePtr;
  char *currLine;
  int *in_stack_00000130;
  double *in_stack_00000138;
  double *in_stack_00000140;
  char *in_stack_00000148;
  double in_stack_00000150;
  double in_stack_00000158;
  double in_stack_00000160;
  double in_stack_00000168;
  double in_stack_00000170;
  double in_stack_00000178;
  double in_stack_00000180;
  double in_stack_00000188;
  double in_stack_000001a0;
  size_t in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  SAORegion *in_stack_fffffffffffffef0;
  int local_f4;
  int local_e0;
  uint local_d8;
  uint local_d4;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double *local_90;
  long local_80;
  size_t local_70;
  long local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  int *local_28;
  undefined8 *local_20;
  int *local_18;
  char *local_10;
  int local_4;
  
  if (*in_RCX == 0) {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    __ptr = (int *)malloc(0x58);
    if (__ptr == (int *)0x0) {
      ffpmsg((char *)0x25329f);
      *local_28 = 0x71;
      local_4 = 0x71;
    }
    else {
      *__ptr = 0;
      __ptr[2] = 0;
      __ptr[3] = 0;
      if ((local_18 == (int *)0x0) || (*local_18 == 0)) {
        __ptr[4] = 0;
      }
      else {
        memcpy(__ptr + 4,local_18,0x48);
      }
      local_f4 = 0;
      local_68 = 0x200;
      local_30 = (char *)malloc(0x200);
      if (local_30 == (char *)0x0) {
        free(__ptr);
        ffpmsg((char *)0x253364);
        *local_28 = 0x71;
        local_4 = 0x71;
      }
      else {
        __stream = fopen64(local_10,"r");
        if (__stream == (FILE *)0x0) {
          snprintf(local_30,0x200,"Could not open Region file %s.",local_10);
          ffpmsg((char *)0x2533d4);
          free(local_30);
          free(__ptr);
          *local_28 = 0x68;
          local_4 = 0x68;
        }
        else {
          *local_28 = 0x68;
LAB_00253417:
          pcVar3 = fgets(local_30,(int)local_68,__stream);
          if (pcVar3 != (char *)0x0) {
            *local_28 = 0;
            local_70 = strlen(local_30);
            while( true ) {
              bVar9 = false;
              if (local_70 == local_68 - 1U) {
                bVar9 = local_30[local_70 - 1] != '\n';
              }
              if (!bVar9) break;
              local_48 = (char *)realloc(local_30,local_68 << 1);
              if (local_48 == (char *)0x0) {
                ffpmsg((char *)0x2534e9);
                *local_28 = 0x71;
                goto LAB_0025506d;
              }
              local_30 = local_48;
              fgets(local_48 + local_70,(int)local_68 + 1,__stream);
              local_68 = local_68 * 2;
              sVar4 = strlen(local_30 + local_70);
              local_70 = sVar4 + local_70;
            }
            local_48 = local_30;
            if (*local_30 == '#') {
              do {
                local_48 = local_48 + 1;
                ppuVar5 = __ctype_b_loc();
              } while (((*ppuVar5)[(int)*local_48] & 0x2000) != 0);
              iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                       in_stack_fffffffffffffec8);
              if (iVar2 == 0) {
                if (*__ptr != 0) {
                  ffpmsg((char *)0x253620);
                  *local_28 = 0x1af;
                  goto LAB_0025506d;
                }
                local_48 = local_48 + 7;
                while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*local_48] & 0x2000) != 0) {
                  local_48 = local_48 + 1;
                }
                iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                         in_stack_fffffffffffffec8);
                if (iVar2 == 0) {
                  local_f4 = 0;
                }
                else {
                  iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                           in_stack_fffffffffffffec8);
                  if (iVar2 == 0) {
                    local_f4 = 1;
                  }
                  else {
                    iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                             in_stack_fffffffffffffec8);
                    if ((iVar2 != 0) &&
                       (iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
                                                 ,in_stack_fffffffffffffec8), iVar2 != 0)) {
                      ffpmsg((char *)0x253730);
                      *local_28 = 0x1af;
                      goto LAB_0025506d;
                    }
                    local_f4 = 2;
                  }
                }
              }
            }
            else {
              iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                       in_stack_fffffffffffffec8);
              if (iVar2 != 0) {
LAB_00253775:
                do {
                  if (*local_48 == '\0') break;
                  local_38 = local_48;
                  local_40 = (char *)0x0;
                  local_d4 = 1;
                  bVar9 = false;
                  pcVar3 = local_40;
LAB_002537b5:
                  local_40 = pcVar3;
                  bVar10 = false;
                  if ((!bVar9) && (bVar10 = false, *local_28 == 0)) {
                    bVar10 = *local_48 != '\0';
                  }
                  if (bVar10) {
                    cVar1 = *local_48;
                    pcVar3 = local_40;
                    if ((cVar1 == '\n') || (cVar1 == '#')) {
                      *local_48 = '\0';
                      if (local_40 == (char *)0x0) {
                        bVar9 = true;
                      }
                    }
                    else {
                      if (cVar1 != '(') {
                        if (cVar1 == ')') {
                          *local_48 = '\0';
                          local_48 = local_48 + 1;
                          if (local_40 == (char *)0x0) {
                            *local_28 = 1;
                          }
                          else {
                            bVar9 = true;
                          }
                          goto LAB_002537b5;
                        }
                        if (cVar1 == ',') {
                          local_d4 = local_d4 + 1;
                        }
                        else {
                          if (cVar1 == ':') {
                            local_48 = local_48 + 1;
                            if (local_40 != (char *)0x0) {
                              local_f4 = 2;
                            }
                            goto LAB_002537b5;
                          }
                          if (cVar1 == 'd') {
                            local_48 = local_48 + 1;
                            if (local_40 != (char *)0x0) {
                              local_f4 = 1;
                            }
                            goto LAB_002537b5;
                          }
                        }
                        local_48 = local_48 + 1;
                        goto LAB_002537b5;
                      }
                      *local_48 = '\0';
                      local_48 = local_48 + 1;
                      pcVar3 = local_48;
                      if (local_40 != (char *)0x0) {
                        *local_28 = 1;
                        pcVar3 = local_40;
                      }
                    }
                    goto LAB_002537b5;
                  }
                  if ((*local_28 != 0) || (!bVar9)) {
                    ffpmsg((char *)0x2539b6);
                    *local_28 = 0x1af;
                    goto LAB_0025506d;
                  }
                  while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*local_38] & 0x2000) != 0) {
                    local_38 = local_38 + 1;
                  }
                  if ((*local_38 != '\0') || (local_40 != (char *)0x0)) {
                    iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                             in_stack_fffffffffffffec8);
                    if (iVar2 == 0) {
                      local_38 = local_38 + 6;
                      local_f4 = 0;
                    }
                    else {
                      iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                                               in_stack_fffffffffffffec8);
                      if (iVar2 == 0) {
                        local_38 = local_38 + 9;
                        local_f4 = 0;
                      }
                      else {
                        iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0
                                                 ,in_stack_fffffffffffffec8);
                        if (iVar2 == 0) {
                          local_38 = local_38 + 7;
                          local_f4 = 0;
                        }
                        else {
                          iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                   in_stack_fffffffffffffed0,
                                                   in_stack_fffffffffffffec8);
                          if (iVar2 == 0) {
                            local_38 = local_38 + 4;
                            local_f4 = 1;
                          }
                          else {
                            iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                     in_stack_fffffffffffffed0,
                                                     in_stack_fffffffffffffec8);
                            if (iVar2 == 0) {
                              local_38 = local_38 + 4;
                              local_f4 = 1;
                            }
                            else {
                              iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                       in_stack_fffffffffffffed0,
                                                       in_stack_fffffffffffffec8);
                              if (iVar2 == 0) {
                                local_38 = local_38 + 5;
                                local_f4 = 1;
                              }
                              else {
                                iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                         in_stack_fffffffffffffed0,
                                                         in_stack_fffffffffffffec8);
                                if (iVar2 == 0) {
                                  local_f4 = 1;
                                  goto LAB_00253775;
                                }
                                iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                         in_stack_fffffffffffffed0,
                                                         in_stack_fffffffffffffec8);
                                if (iVar2 == 0) {
                                  local_f4 = 1;
                                  goto LAB_00253775;
                                }
                                iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                         in_stack_fffffffffffffed0,
                                                         in_stack_fffffffffffffec8);
                                if (iVar2 == 0) {
                                  local_f4 = 1;
                                  goto LAB_00253775;
                                }
                                iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                         in_stack_fffffffffffffed0,
                                                         in_stack_fffffffffffffec8);
                                if (iVar2 == 0) {
                                  local_f4 = 0;
                                  goto LAB_00253775;
                                }
                                iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                         in_stack_fffffffffffffed0,
                                                         in_stack_fffffffffffffec8);
                                if (iVar2 == 0) {
                                  local_f4 = 0;
                                  goto LAB_00253775;
                                }
                                iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                         in_stack_fffffffffffffed0,
                                                         in_stack_fffffffffffffec8);
                                if (iVar2 == 0) {
                                  ffpmsg((char *)0x253c9d);
                                  ffpmsg((char *)0x253caa);
                                  *local_28 = 0x1af;
                                  goto LAB_0025506d;
                                }
                                iVar2 = fits_strncasecmp(in_stack_fffffffffffffed8,
                                                         in_stack_fffffffffffffed0,
                                                         in_stack_fffffffffffffec8);
                                if (iVar2 == 0) {
                                  ffpmsg((char *)0x253ce7);
                                  ffpmsg((char *)0x253cf4);
                                  *local_28 = 0x1af;
                                  goto LAB_0025506d;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if (*__ptr % 10 == 0) {
                      if (*(long *)(__ptr + 2) == 0) {
                        in_stack_fffffffffffffef0 = (SAORegion *)malloc(0x690);
                      }
                      else {
                        in_stack_fffffffffffffef0 =
                             (SAORegion *)realloc(*(void **)(__ptr + 2),(long)(*__ptr + 10) * 0xa8);
                      }
                      if (in_stack_fffffffffffffef0 == (SAORegion *)0x0) {
                        ffpmsg((char *)0x253d9a);
                        *local_28 = 0x71;
                        goto LAB_0025506d;
                      }
                      *(SAORegion **)(__ptr + 2) = in_stack_fffffffffffffef0;
                    }
                    iVar2 = *__ptr;
                    *__ptr = iVar2 + 1;
                    puVar6 = (undefined1 *)(*(long *)(__ptr + 2) + (long)iVar2 * 0xa8);
                    *puVar6 = 1;
                    *(undefined4 *)(puVar6 + 4) = 0;
                    for (local_e0 = 0; local_e0 < 8; local_e0 = local_e0 + 1) {
                      *(undefined8 *)(puVar6 + (long)local_e0 * 8 + 0x30) = 0;
                    }
                    *(undefined8 *)(puVar6 + 0x98) = 0;
                    *(undefined8 *)(puVar6 + 0xa0) = 0;
                    *(undefined8 *)(puVar6 + 0x88) = 0;
                    *(undefined8 *)(puVar6 + 0x90) = 0;
                    while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*local_38] & 0x2000) != 0) {
                      local_38 = local_38 + 1;
                    }
                    if (*local_38 == '+') {
                      local_38 = local_38 + 1;
                    }
                    else if (*local_38 == '-') {
                      local_38 = local_38 + 1;
                      *puVar6 = 0;
                    }
                    while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*local_38] & 0x2000) != 0) {
                      local_38 = local_38 + 1;
                    }
                    if (*local_38 == '\0') {
                      ffpmsg((char *)0x253f41);
                      *local_28 = 0x1af;
                      goto LAB_0025506d;
                    }
                    local_70 = strlen(local_38);
                    while( true ) {
                      local_70 = local_70 - 1;
                      ppuVar5 = __ctype_b_loc();
                      if (((*ppuVar5)[(int)local_38[local_70]] & 0x2000) == 0) break;
                      local_38[local_70] = '\0';
                    }
                    iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                    if (iVar2 == 0) {
                      *(undefined4 *)(puVar6 + 4) = 2;
                      if (local_d4 != 3) {
                        *local_28 = 0x1af;
                      }
                      local_d8 = 2;
                    }
                    else {
                      iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
                      if (iVar2 == 0) {
                        *(undefined4 *)(puVar6 + 4) = 3;
                        if (local_d4 != 4) {
                          *local_28 = 0x1af;
                        }
                        local_d8 = 2;
                      }
                      else {
                        iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0)
                        ;
                        if (iVar2 == 0) {
                          if (((int)local_d4 < 4) || (8 < (int)local_d4)) {
                            *local_28 = 0x1af;
                          }
                          else if ((int)local_d4 < 6) {
                            *(undefined4 *)(puVar6 + 4) = 4;
                            *(undefined8 *)(puVar6 + 0x50) = 0;
                          }
                          else {
                            *(undefined4 *)(puVar6 + 4) = 5;
                            *(undefined8 *)(puVar6 + 0x60) = 0;
                            *(undefined8 *)(puVar6 + 0x68) = 0;
                          }
                          local_d8 = 2;
                        }
                        else {
                          iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                  in_stack_fffffffffffffed0);
                          if (iVar2 == 0) {
                            *(undefined4 *)(puVar6 + 4) = 5;
                            if ((local_d4 != 8) && (local_d4 != 6)) {
                              *local_28 = 0x1af;
                            }
                            *(undefined8 *)(puVar6 + 0x60) = 0;
                            *(undefined8 *)(puVar6 + 0x68) = 0;
                            local_d8 = 2;
                          }
                          else {
                            iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                    in_stack_fffffffffffffed0);
                            if ((iVar2 == 0) ||
                               (iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                        in_stack_fffffffffffffed0), iVar2 == 0)) {
                              if (((int)local_d4 < 4) || (8 < (int)local_d4)) {
                                *local_28 = 0x1af;
                              }
                              else if ((int)local_d4 < 6) {
                                *(undefined4 *)(puVar6 + 4) = 6;
                                *(undefined8 *)(puVar6 + 0x50) = 0;
                              }
                              else {
                                *(undefined4 *)(puVar6 + 4) = 7;
                                *(undefined8 *)(puVar6 + 0x60) = 0;
                                *(undefined8 *)(puVar6 + 0x68) = 0;
                              }
                              local_d8 = 2;
                            }
                            else {
                              iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                      in_stack_fffffffffffffed0);
                              if ((iVar2 == 0) ||
                                 (iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                          in_stack_fffffffffffffed0), iVar2 == 0)) {
                                *(undefined4 *)(puVar6 + 4) = 8;
                                if (((int)local_d4 < 4) || (5 < (int)local_d4)) {
                                  *local_28 = 0x1af;
                                }
                                *(undefined8 *)(puVar6 + 0x50) = 0;
                                local_d8 = 4;
                              }
                              else {
                                iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                        in_stack_fffffffffffffed0);
                                if ((((iVar2 == 0) ||
                                     (iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                              in_stack_fffffffffffffed0), iVar2 == 0
                                     )) || (iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                                    in_stack_fffffffffffffed0),
                                           iVar2 == 0)) ||
                                   (iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                            in_stack_fffffffffffffed0), iVar2 == 0))
                                {
                                  *(undefined4 *)(puVar6 + 4) = 9;
                                  if (((int)local_d4 < 4) || (5 < (int)local_d4)) {
                                    *local_28 = 0x1af;
                                  }
                                  *(undefined8 *)(puVar6 + 0x50) = 0;
                                  local_d8 = 2;
                                }
                                else {
                                  iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                          in_stack_fffffffffffffed0);
                                  if ((iVar2 == 0) ||
                                     (iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                              in_stack_fffffffffffffed0), iVar2 == 0
                                     )) {
                                    *(undefined4 *)(puVar6 + 4) = 10;
                                    if (local_d4 != 4) {
                                      *local_28 = 0x1af;
                                    }
                                    local_d8 = 2;
                                  }
                                  else {
                                    iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                            in_stack_fffffffffffffed0);
                                    if (iVar2 == 0) {
                                      *(undefined4 *)(puVar6 + 4) = 0;
                                      if (local_d4 != 2) {
                                        *local_28 = 0x1af;
                                      }
                                      local_d8 = 2;
                                    }
                                    else {
                                      iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                              in_stack_fffffffffffffed0);
                                      if (iVar2 == 0) {
                                        *(undefined4 *)(puVar6 + 4) = 1;
                                        if (local_d4 != 4) {
                                          *local_28 = 0x1af;
                                        }
                                        local_d8 = 4;
                                      }
                                      else {
                                        iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                                in_stack_fffffffffffffed0);
                                        if (iVar2 == 0) {
                                          *(undefined4 *)(puVar6 + 4) = 0xb;
                                          if (((int)local_d4 < 6) || ((local_d4 & 1) != 0)) {
                                            *local_28 = 0x1af;
                                          }
                                          local_d8 = local_d4;
                                        }
                                        else {
                                          iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                                  in_stack_fffffffffffffed0);
                                          if (iVar2 == 0) {
                                            *(undefined4 *)(puVar6 + 4) = 0xc;
                                            if (local_d4 != 8) {
                                              *local_28 = 0x1af;
                                            }
                                          }
                                          else {
                                            iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                                    in_stack_fffffffffffffed0);
                                            if (iVar2 == 0) {
                                              *(undefined4 *)(puVar6 + 4) = 0xd;
                                              if (((int)local_d4 < 10) || (0xb < (int)local_d4)) {
                                                *local_28 = 0x1af;
                                              }
                                              *(undefined8 *)(puVar6 + 0x80) = 0;
                                            }
                                            else {
                                              iVar2 = fits_strcasecmp(in_stack_fffffffffffffed8,
                                                                      in_stack_fffffffffffffed0);
                                              if (iVar2 != 0) {
                                                ffpmsg((char *)0x254551);
                                                ffpmsg((char *)0x25455e);
                                                *local_28 = 0x1af;
                                                goto LAB_0025506d;
                                              }
                                              *(undefined4 *)(puVar6 + 4) = 0xe;
                                              if (((int)local_d4 < 10) || (0xb < (int)local_d4)) {
                                                *local_28 = 0x1af;
                                              }
                                              *(undefined8 *)(puVar6 + 0x80) = 0;
                                            }
                                          }
                                          local_d8 = 2;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    if (*local_28 != 0) {
                      ffpmsg((char *)0x2545a4);
                      ffpmsg((char *)0x2545b1);
                      goto LAB_0025506d;
                    }
                    if (*(int *)(puVar6 + 4) == 0xb) {
                      pvVar7 = malloc((long)(int)local_d4 << 3);
                      *(void **)(puVar6 + 0x38) = pvVar7;
                      if (*(long *)(puVar6 + 0x38) == 0) {
                        ffpmsg((char *)0x2545f3);
                        *local_28 = 0x71;
                        goto LAB_0025506d;
                      }
                      *(uint *)(puVar6 + 0x30) = local_d4;
                      local_90 = *(double **)(puVar6 + 0x38);
                    }
                    else {
                      local_90 = (double *)(puVar6 + 0x30);
                    }
                    for (local_e0 = 0; pcVar3 = local_40, local_e0 < (int)local_d8;
                        local_e0 = local_e0 + 2) {
                      local_50 = local_40;
                      for (; *local_40 != ','; local_40 = local_40 + 1) {
                      }
                      local_58 = local_40 + 1;
                      *local_40 = '\0';
                      local_40 = local_58;
                      while( true ) {
                        in_stack_fffffffffffffee7 = false;
                        if (*local_40 != ',') {
                          in_stack_fffffffffffffee7 = *local_40 != '\0';
                        }
                        if ((bool)in_stack_fffffffffffffee7 == false) break;
                        local_40 = local_40 + 1;
                      }
                      *local_40 = '\0';
                      local_40 = local_40 + 1;
                      pcVar3 = strchr(pcVar3,0x3a);
                      if (pcVar3 == (char *)0x0) {
                        local_98 = atof(local_50);
                        local_a0 = atof(local_58);
                      }
                      else {
                        local_f4 = 2;
                        local_80 = 0;
                        local_b8 = 0.0;
                        lVar8 = strtol(local_50,&local_60,10);
                        if ((local_60 != (char *)0x0) && (*local_60 == ':')) {
                          local_50 = local_60 + 1;
                          local_80 = strtol(local_50,&local_60,10);
                          if ((local_60 != (char *)0x0) && (*local_60 == ':')) {
                            local_50 = local_60 + 1;
                            local_b8 = atof(local_50);
                          }
                        }
                        local_98 = ((double)lVar8 + (double)local_80 / 60.0 + local_b8 / 3600.0) *
                                   15.0;
                        local_80 = 0;
                        local_b8 = 0.0;
                        while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)*local_58] & 0x2000) != 0
                              ) {
                          local_58 = local_58 + 1;
                        }
                        cVar1 = *local_58;
                        if (cVar1 == '-') {
                          local_58 = local_58 + 1;
                        }
                        lVar8 = strtol(local_58,&local_60,10);
                        if ((local_60 != (char *)0x0) && (*local_60 == ':')) {
                          local_58 = local_60 + 1;
                          local_80 = strtol(local_58,&local_60,10);
                          if ((local_60 != (char *)0x0) && (*local_60 == ':')) {
                            local_58 = local_60 + 1;
                            local_b8 = atof(local_58);
                          }
                        }
                        if (cVar1 == '-') {
                          local_a0 = ((double)-lVar8 - (double)local_80 / 60.0) - local_b8 / 3600.0;
                        }
                        else {
                          local_a0 = (double)lVar8 + (double)local_80 / 60.0 + local_b8 / 3600.0;
                        }
                      }
                      if (local_f4 != 0) {
                        if ((local_18 == (int *)0x0) || (*local_18 == 0)) {
                          ffpmsg((char *)0x254abd);
                          *local_28 = 0x1f9;
                          goto LAB_0025506d;
                        }
                        in_stack_fffffffffffffec8 = *(size_t *)(local_18 + 0xe);
                        iVar2 = ffxypx(in_stack_00000188,in_stack_00000180,in_stack_00000178,
                                       in_stack_00000170,in_stack_00000168,in_stack_00000160,
                                       in_stack_00000158,in_stack_00000150,in_stack_000001a0,
                                       in_stack_00000148,in_stack_00000140,in_stack_00000138,
                                       in_stack_00000130);
                        if (iVar2 != 0) {
                          ffpmsg((char *)0x254b7e);
                          goto LAB_0025506d;
                        }
                        local_98 = local_a8;
                        local_a0 = local_b0;
                      }
                      local_90[local_e0] = local_98;
                      local_90[local_e0 + 1] = local_a0;
                    }
                    for (; pcVar3 = local_40, local_e0 < (int)local_d4; local_e0 = local_e0 + 1) {
                      local_50 = local_40;
                      while( true ) {
                        in_stack_fffffffffffffee6 = false;
                        if (*local_40 != ',') {
                          in_stack_fffffffffffffee6 = *local_40 != '\0';
                        }
                        if ((bool)in_stack_fffffffffffffee6 == false) break;
                        local_40 = local_40 + 1;
                      }
                      *local_40 = '\0';
                      local_40 = local_40 + 1;
                      dVar11 = strtod(pcVar3,&local_60);
                      local_90[local_e0] = dVar11;
                      if ((local_60 != (char *)0x0) &&
                         (((*local_60 == '\"' || (*local_60 == '\'')) || (*local_60 == 'd')))) {
                        in_stack_fffffffffffffec8 = *(size_t *)(local_18 + 0xe);
                        iVar2 = ffxypx(in_stack_00000188,in_stack_00000180,in_stack_00000178,
                                       in_stack_00000170,in_stack_00000168,in_stack_00000160,
                                       in_stack_00000158,in_stack_00000150,in_stack_000001a0,
                                       in_stack_00000148,in_stack_00000140,in_stack_00000138,
                                       in_stack_00000130);
                        if (iVar2 != 0) {
                          ffpmsg((char *)0x254e4b);
                          goto LAB_0025506d;
                        }
                        in_stack_fffffffffffffed8 = (char *)pow(local_a8 - *local_90,2.0);
                        dVar11 = pow(local_b0 - local_90[1],2.0);
                        dVar11 = sqrt((double)in_stack_fffffffffffffed8 + dVar11);
                        local_90[local_e0] = dVar11;
                      }
                    }
                    if (((*(int *)(puVar6 + 4) == 5) || (*(int *)(puVar6 + 4) == 7)) &&
                       (local_d4 == 7)) {
                      local_90[7] = local_90[6];
                    }
                    if (local_f4 != 0) {
                      in_stack_fffffffffffffed0 = (char *)(ulong)(*(int *)(puVar6 + 4) - 4);
                      switch(in_stack_fffffffffffffed0) {
                      case (char *)0x0:
                      case (char *)0x2:
                      case (char *)0x4:
                      case (char *)0x5:
                        local_90[4] = *(double *)(local_18 + 0xe) + local_90[4];
                        break;
                      case (char *)0x1:
                      case (char *)0x3:
                        local_90[6] = *(double *)(local_18 + 0xe) + local_90[6];
                        local_90[7] = *(double *)(local_18 + 0xe) + local_90[7];
                        break;
                      case (char *)0x6:
                      case (char *)0x8:
                        local_90[2] = *(double *)(local_18 + 0xe) + local_90[2];
                        local_90[3] = *(double *)(local_18 + 0xe) + local_90[3];
                        break;
                      case (char *)0x9:
                      case (char *)0xa:
                        local_90[2] = *(double *)(local_18 + 0xe) + local_90[2];
                        local_90[3] = *(double *)(local_18 + 0xe) + local_90[3];
                        local_90[10] = *(double *)(local_18 + 0xe) + local_90[10];
                      default:
                      }
                    }
                    fits_setup_shape((RgnShape *)__stream);
                  }
                } while( true );
              }
            }
            goto LAB_00253417;
          }
          fits_set_region_components
                    ((SAORegion *)
                     CONCAT17(in_stack_fffffffffffffee7,
                              CONCAT16(in_stack_fffffffffffffee6,in_stack_fffffffffffffee0)));
LAB_0025506d:
          if (*local_28 == 0) {
            *local_20 = __ptr;
          }
          else {
            fits_free_region(in_stack_fffffffffffffef0);
          }
          fclose(__stream);
          free(local_30);
          local_4 = *local_28;
        }
      }
    }
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int fits_read_ascii_region( const char *filename,
			    WCSdata    *wcs,
			    SAORegion  **Rgn,
			    int        *status )
/*  Read regions from a SAO-style region file and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{
   char     *currLine;
   char     *namePtr, *paramPtr, *currLoc;
   char     *pX, *pY, *endp;
   long     allocLen, lineLen, hh, mm, dd;
   double   *coords, X, Y, x, y, ss, div, xsave= 0., ysave= 0.;
   int      nParams, nCoords, negdec;
   int      i, done;
   FILE     *rgnFile;
   coordFmt cFmt;
   SAORegion *aRgn;
   RgnShape *newShape, *tmpShape;

   if( *status ) return( *status );

   aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
   if( ! aRgn ) {
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }
   aRgn->nShapes    =    0;
   aRgn->Shapes     = NULL;
   if( wcs && wcs->exists )
      aRgn->wcs = *wcs;
   else
      aRgn->wcs.exists = 0;

   cFmt = pixel_fmt; /* set default format */

   /*  Allocate Line Buffer  */

   allocLen = 512;
   currLine = (char *)malloc( allocLen * sizeof(char) );
   if( !currLine ) {
      free( aRgn );
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }

   /*  Open Region File  */

   if( (rgnFile = fopen( filename, "r" ))==NULL ) {
      snprintf(currLine,allocLen,"Could not open Region file %s.",filename);
      ffpmsg( currLine );
      free( currLine );
      free( aRgn );
      return( *status = FILE_NOT_OPENED );
   }
   
   /*  Read in file, line by line  */
   /*  First, set error status in case file is empty */ 
   *status = FILE_NOT_OPENED;

   while( fgets(currLine,allocLen,rgnFile) != NULL ) {

      /* reset status if we got here */
      *status = 0;

      /*  Make sure we have a full line of text  */

      lineLen = strlen(currLine);
      while( lineLen==allocLen-1 && currLine[lineLen-1]!='\n' ) {
         currLoc = (char *)realloc( currLine, 2 * allocLen * sizeof(char) );
         if( !currLoc ) {
            ffpmsg("Couldn't allocate memory to hold Region file contents.");
            *status = MEMORY_ALLOCATION;
            goto error;
         } else {
            currLine = currLoc;
         }
         fgets( currLine+lineLen, allocLen+1, rgnFile );
         allocLen += allocLen;
         lineLen  += strlen(currLine+lineLen);
      }

      currLoc = currLine;
      if( *currLoc == '#' ) {

         /*  Look to see if it is followed by a format statement...  */
         /*  if not skip line                                        */

         currLoc++;
         while( isspace(*currLoc) ) currLoc++;
         if( !fits_strncasecmp( currLoc, "format:", 7 ) ) {
            if( aRgn->nShapes ) {
               ffpmsg("Format code encountered after reading 1 or more shapes.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            currLoc += 7;
            while( isspace(*currLoc) ) currLoc++;
            if( !fits_strncasecmp( currLoc, "pixel", 5 ) ) {
               cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( currLoc, "degree", 6 ) ) {
               cFmt = degree_fmt;
            } else if( !fits_strncasecmp( currLoc, "hhmmss", 6 ) ) {
               cFmt = hhmmss_fmt;
            } else if( !fits_strncasecmp( currLoc, "hms", 3 ) ) {
               cFmt = hhmmss_fmt;
            } else {
               ffpmsg("Unknown format code encountered in region file.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
         }

      } else if( !fits_strncasecmp( currLoc, "glob", 4 ) ) {
		  /* skip lines that begin with the word 'global' */

      } else {

         while( *currLoc != '\0' ) {

            namePtr  = currLoc;
            paramPtr = NULL;
            nParams  = 1;

            /*  Search for closing parenthesis  */

            done = 0;
            while( !done && !*status && *currLoc ) {
               switch (*currLoc) {
               case '(':
                  *currLoc = '\0';
                  currLoc++;
                  if( paramPtr )   /* Can't have two '(' in a region! */
                     *status = 1;
                  else
                     paramPtr = currLoc;
                  break;
               case ')':
                  *currLoc = '\0';
                  currLoc++;
                  if( !paramPtr )  /* Can't have a ')' without a '(' first */
                     *status = 1;
                  else
                     done = 1;
                  break;
               case '#':
               case '\n':
                  *currLoc = '\0';
                  if( !paramPtr )  /* Allow for a blank line */
                     done = 1;
                  break;
               case ':':  
                  currLoc++;
                  if ( paramPtr ) cFmt = hhmmss_fmt; /* set format if parameter has : */
                  break;
               case 'd':
                  currLoc++;
                  if ( paramPtr ) cFmt = degree_fmt; /* set format if parameter has d */  
                  break;
               case ',':
                  nParams++;  /* Fall through to default */
               default:
                  currLoc++;
                  break;
               }
            }
            if( *status || !done ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /*  Skip white space in region name  */

            while( isspace(*namePtr) ) namePtr++;

            /*  Was this a blank line? Or the end of the current one  */

            if( ! *namePtr && ! paramPtr ) continue;

            /*  Check for format code at beginning of the line */

            if( !fits_strncasecmp( namePtr, "image;", 6 ) ) {
				namePtr += 6;
				cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "physical;", 9 ) ) {
                                namePtr += 9;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "linear;", 7 ) ) {
                                namePtr += 7;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk4;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk5;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "icrs;", 5 ) ) {
				namePtr += 5;
				cFmt = degree_fmt;

            /* the following 5 cases support region files created by POW 
	       (or ds9 Version 4.x) which
               may have lines containing  only a format code, not followed
               by a ';' (and with no region specifier on the line).  We use
               the 'continue' statement to jump to the end of the loop and
               then continue reading the next line of the region file. */

            } else if( !fits_strncasecmp( namePtr, "fk5", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "fk4", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "icrs", 4 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "image", 5 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "physical", 8 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */


            } else if( !fits_strncasecmp( namePtr, "galactic;", 9 ) ) {
               ffpmsg( "Galactic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            } else if( !fits_strncasecmp( namePtr, "ecliptic;", 9 ) ) {
               ffpmsg( "ecliptic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /**************************************************/
            /*  We've apparently found a region... Set it up  */
            /**************************************************/

            if( !(aRgn->nShapes % 10) ) {
               if( aRgn->Shapes )
                  tmpShape = (RgnShape *)realloc( aRgn->Shapes,
                                                  (10+aRgn->nShapes)
                                                  * sizeof(RgnShape) );
               else
                  tmpShape = (RgnShape *) malloc( 10 * sizeof(RgnShape) );
               if( tmpShape ) {
                  aRgn->Shapes = tmpShape;
               } else {
                  ffpmsg( "Failed to allocate memory for Region data");
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }

            }
            newShape        = &aRgn->Shapes[aRgn->nShapes++];
            newShape->sign  = 1;
            newShape->shape = point_rgn;
	    for (i=0; i<8; i++) newShape->param.gen.p[i] = 0.0;
	    newShape->param.gen.a = 0.0;
	    newShape->param.gen.b = 0.0;
	    newShape->param.gen.sinT = 0.0;
	    newShape->param.gen.cosT = 0.0;

            while( isspace(*namePtr) ) namePtr++;
            
			/*  Check for the shape's sign  */

            if( *namePtr=='+' ) {
               namePtr++;
            } else if( *namePtr=='-' ) {
               namePtr++;
               newShape->sign = 0;
            }

            /* Skip white space in region name */

            while( isspace(*namePtr) ) namePtr++;
            if( *namePtr=='\0' ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            lineLen = strlen( namePtr ) - 1;
            while( isspace(namePtr[lineLen]) ) namePtr[lineLen--] = '\0';

            /*  Now identify the region  */

            if(        !fits_strcasecmp( namePtr, "circle"  ) ) {
               newShape->shape = circle_rgn;
               if( nParams != 3 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "annulus" ) ) {
               newShape->shape = annulus_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "ellipse" ) ) {
               if( nParams < 4 || nParams > 8 ) {
                  *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = ellipse_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		 newShape->shape = elliptannulus_rgn;
		 newShape->param.gen.p[6] = 0.0;
		 newShape->param.gen.p[7] = 0.0;
	       }
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "elliptannulus" ) ) {
               newShape->shape = elliptannulus_rgn;
               if( !( nParams==8 || nParams==6 ) )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[6] = 0.0;
               newShape->param.gen.p[7] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "box"    ) 
                    || !fits_strcasecmp( namePtr, "rotbox" ) ) {
	       if( nParams < 4 || nParams > 8 ) {
		 *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = box_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		  newShape->shape = boxannulus_rgn;
		  newShape->param.gen.p[6] = 0.0;
		  newShape->param.gen.p[7] = 0.0;
	       }
	       nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "rectangle"    )
                    || !fits_strcasecmp( namePtr, "rotrectangle" ) ) {
               newShape->shape = rectangle_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "diamond"    )
                    || !fits_strcasecmp( namePtr, "rotdiamond" )
                    || !fits_strcasecmp( namePtr, "rhombus"    )
                    || !fits_strcasecmp( namePtr, "rotrhombus" ) ) {
               newShape->shape = diamond_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "sector"  )
                    || !fits_strcasecmp( namePtr, "pie"     ) ) {
               newShape->shape = sector_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "point"   ) ) {
               newShape->shape = point_rgn;
               if( nParams != 2 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "line"    ) ) {
               newShape->shape = line_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "polygon" ) ) {
               newShape->shape = poly_rgn;
               if( nParams < 6 || (nParams&1) )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = nParams;
            } else if( !fits_strcasecmp( namePtr, "panda" ) ) {
               newShape->shape = panda_rgn;
               if( nParams != 8 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "epanda" ) ) {
               newShape->shape = epanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "bpanda" ) ) {
               newShape->shape = bpanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else {
               ffpmsg( "Unrecognized region found in region file:" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            if( *status ) {
               ffpmsg( "Wrong number of parameters found for region" );
               ffpmsg( namePtr );
               goto error;
            }

            /*  Parse Parameter string... convert to pixels if necessary  */

            if( newShape->shape==poly_rgn ) {
               newShape->param.poly.Pts = (double *)malloc( nParams
                                                            * sizeof(double) );
               if( !newShape->param.poly.Pts ) {
                  ffpmsg(
                      "Could not allocate memory to hold polygon parameters" );
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }
               newShape->param.poly.nPts = nParams;
               coords = newShape->param.poly.Pts;
            } else
               coords = newShape->param.gen.p;

            /*  Parse the initial "WCS?" coordinates  */
            for( i=0; i<nCoords; i+=2 ) {

               pX = paramPtr;
               while( *paramPtr!=',' ) paramPtr++;
               *(paramPtr++) = '\0';

               pY = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';

               if( strchr(pX, ':' ) ) {
                  /*  Read in special format & convert to decimal degrees  */
                  cFmt = hhmmss_fmt;
                  mm = 0;
                  ss = 0.;
                  hh = strtol(pX, &endp, 10);
                  if (endp && *endp==':') {
                      pX = endp + 1;
                      mm = strtol(pX, &endp, 10);
                      if (endp && *endp==':') {
                          pX = endp + 1;
                          ss = atof( pX );
                      }
                  }
                  X = 15. * (hh + mm/60. + ss/3600.); /* convert to degrees */

                  mm = 0;
                  ss = 0.;
                  negdec = 0;

                  while( isspace(*pY) ) pY++;
                  if (*pY=='-') {
                      negdec = 1;
                      pY++;
                  }
                  dd = strtol(pY, &endp, 10);
                  if (endp && *endp==':') {
                      pY = endp + 1;
                      mm = strtol(pY, &endp, 10);
                      if (endp && *endp==':') {
                          pY = endp + 1;
                          ss = atof( pY );
                      }
                  }
                  if (negdec)
                     Y = -dd - mm/60. - ss/3600.; /* convert to degrees */
                  else
                     Y = dd + mm/60. + ss/3600.;

               } else {
                  X = atof( pX );
                  Y = atof( pY );
               }
               if (i==0) {   /* save 1st coord. in case needed later */
                   xsave = X;
                   ysave = Y;
               }

               if( cFmt!=pixel_fmt ) {
                  /*  Convert to pixels  */
                  if( wcs==NULL || ! wcs->exists ) {
                     ffpmsg("WCS information needed to convert region coordinates.");
                     *status = NO_WCS_KEY;
                     goto error;
                  }
                  
                  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
                                      wcs->xrefpix, wcs->yrefpix,
                                      wcs->xinc,    wcs->yinc,
                                      wcs->rot,     wcs->type,
                              &x, &y, status ) ) {
                     ffpmsg("Error converting region to pixel coordinates.");
                     goto error;
                  }
                  X = x; Y = y;
               }
               coords[i]   = X;
               coords[i+1] = Y;

            }

            /*  Read in remaining parameters...  */

            for( ; i<nParams; i++ ) {
               pX = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';
               coords[i] = strtod( pX, &endp );

	       if (endp && (*endp=='"' || *endp=='\'' || *endp=='d') ) {
		  div = 1.0;
		  if ( *endp=='"' ) div = 3600.0;
		  if ( *endp=='\'' ) div = 60.0;
		  /* parameter given in arcsec so convert to pixels. */
		  /* Increment first Y coordinate by this amount then calc */
		  /* the distance in pixels from the original coordinate. */
		  /* NOTE: This assumes the pixels are square!! */
		  if (ysave < 0.)
		     Y = ysave + coords[i]/div;  /* don't exceed -90 */
		  else
		     Y = ysave - coords[i]/div;  /* don't exceed +90 */

		  X = xsave;
		  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
			       wcs->xrefpix, wcs->yrefpix,
			       wcs->xinc,    wcs->yinc,
			       wcs->rot,     wcs->type,
                               &x, &y, status ) ) {
		     ffpmsg("Error converting region to pixel coordinates.");
		     goto error;
		  }
		 
		  coords[i] = sqrt( pow(x-coords[0],2) + pow(y-coords[1],2) );

               }
            }

	    /* special case for elliptannulus and boxannulus if only one angle
	       was given */

	    if ( (newShape->shape == elliptannulus_rgn || 
		  newShape->shape == boxannulus_rgn ) && nParams == 7 ) {
	      coords[7] = coords[6];
	    }

            /* Also, correct the position angle for any WCS rotation:  */
            /*    If regions are specified in WCS coordintes, then the angles */
            /*    are relative to the WCS system, not the pixel X,Y system */

	    if( cFmt!=pixel_fmt ) {	    
	      switch( newShape->shape ) {
	      case sector_rgn:
	      case panda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		break;
	      case box_rgn:
	      case rectangle_rgn:
	      case diamond_rgn:
	      case ellipse_rgn:
		coords[4] += (wcs->rot);
		break;
	      case boxannulus_rgn:
	      case elliptannulus_rgn:
		coords[6] += (wcs->rot);
		coords[7] += (wcs->rot);
		break;
	      case epanda_rgn:
	      case bpanda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		coords[10] += (wcs->rot);
              default:
                break;
	      }
	    }

	    /* do some precalculations to speed up tests */

	    fits_setup_shape(newShape);

         }  /* End of while( *currLoc ) */
/*
  if (coords)printf("%.8f %.8f %.8f %.8f %.8f\n",
   coords[0],coords[1],coords[2],coords[3],coords[4]); 
*/
      }  /* End of if...else parse line */
   }   /* End of while( fgets(rgnFile) ) */

   /* set up component numbers */

   fits_set_region_components( aRgn );

error:

   if( *status ) {
      fits_free_region( aRgn );
   } else {
      *Rgn = aRgn;
   }

   fclose( rgnFile );
   free( currLine );

   return( *status );
}